

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall TiXmlNode::IterateChildren(TiXmlNode *this,char *val,TiXmlNode *previous)

{
  int iVar1;
  TiXmlNode *pTVar2;
  
  if (previous == (TiXmlNode *)0x0) {
    for (pTVar2 = this->firstChild; pTVar2 != (TiXmlNode *)0x0; pTVar2 = pTVar2->next) {
      iVar1 = strcmp(((pTVar2->value).rep_)->str,val);
      if (iVar1 == 0) {
        return pTVar2;
      }
    }
LAB_0010c0e5:
    previous = (TiXmlNode *)0x0;
  }
  else {
    if (previous->parent != this) {
      __assert_fail("previous->parent == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/luckynote[P]ibug_300W_make_landmarks_tools/src/tinyXML/tinyxml.cpp"
                    ,0x197,
                    "const TiXmlNode *TiXmlNode::IterateChildren(const char *, const TiXmlNode *) const"
                   );
    }
    do {
      previous = previous->next;
      if (previous == (TiXmlNode *)0x0) goto LAB_0010c0e5;
      iVar1 = strcmp(((previous->value).rep_)->str,val);
    } while (iVar1 != 0);
  }
  return previous;
}

Assistant:

const TiXmlNode* TiXmlNode::IterateChildren( const char * val, const TiXmlNode* previous ) const
{
	if ( !previous )
	{
		return FirstChild( val );
	}
	else
	{
		assert( previous->parent == this );
		return previous->NextSibling( val );
	}
}